

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::~TEST_GROUP_CppUTestGroupMockPlugin
          (TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  (this->super_Utest)._vptr_Utest = (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockPlugin_002cbd80;
  MockSupportPlugin::~MockSupportPlugin(&this->plugin);
  StringBufferTestOutput::~StringBufferTestOutput(&this->output);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_GROUP(MockPlugin)
{
    StringBufferTestOutput output;

    UtestShell *test;
    TestResult *result;

    MockSupportPlugin plugin;

    void setup() _override
    {
        test = new UtestShell("group", "name", "file", 1);
        result = new TestResult(output);
    }

    void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }
}